

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

UnitsMap * __thiscall
libcellml::Analyser::AnalyserImpl::multiplyDivideUnitsMaps
          (UnitsMap *__return_storage_ptr__,AnalyserImpl *this,UnitsMap *firstUnitsMap,
          UnitsMap *secondUnitsMap,bool multiply)

{
  bool bVar1;
  iterator __position;
  _Base_ptr p_Var2;
  undefined3 in_register_00000081;
  _Rb_tree_header *p_Var3;
  double dVar4;
  double a;
  double local_38;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::_Rb_tree(&__return_storage_ptr__->_M_t,&firstUnitsMap->_M_t);
  if (CONCAT31(in_register_00000081,multiply) == 0) {
    dVar4 = -1.0;
  }
  else {
    dVar4 = 1.0;
  }
  p_Var2 = (secondUnitsMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(secondUnitsMap->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    do {
      __position = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::find(&__return_storage_ptr__->_M_t,(key_type *)(p_Var2 + 1));
      if ((_Rb_tree_header *)__position._M_node ==
          &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header) {
        local_38 = *(double *)(p_Var2 + 2) * dVar4;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,double>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                    *)__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1)
                   ,&local_38);
      }
      else {
        a = *(double *)(p_Var2 + 2) * dVar4 + *(double *)(__position._M_node + 2);
        *(double *)(__position._M_node + 2) = a;
        bVar1 = areNearlyEqual(a,0.0);
        if (bVar1) {
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
          ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,double>,std::_Select1st<std::pair<std::__cxx11::string_const,double>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                              *)__return_storage_ptr__,__position);
        }
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return __return_storage_ptr__;
}

Assistant:

UnitsMap Analyser::AnalyserImpl::multiplyDivideUnitsMaps(const UnitsMap &firstUnitsMap,
                                                         const UnitsMap &secondUnitsMap,
                                                         bool multiply)
{
    // Multiply/divide the given units maps together, following a multiplication
    // (multiply = true) or a division (multiply = false).

    auto res = firstUnitsMap;
    auto sign = multiply ? 1.0 : -1.0;

    for (const auto &units : secondUnitsMap) {
        auto it = res.find(units.first);

        if (it == res.end()) {
            res.emplace(units.first, sign * units.second);
        } else {
            it->second += sign * units.second;

            if (areNearlyEqual(it->second, 0.0)) {
                // The units has now an exponent value of zero, so no need to
                // track it anymore.

                res.erase(it);
            }
        }
    }

    return res;
}